

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pa_hostapi_skeleton.c
# Opt level: O1

PaError ReadStream(PaStream *s,void *buffer,unsigned_long frames)

{
  int iVar1;
  int iVar2;
  PaError extraout_EAX;
  unsigned_long numFrames;
  char *format;
  int xrun;
  unsigned_long framesGot;
  void *userBuffer;
  unsigned_long framesAvail;
  PaError local_60;
  int local_5c;
  unsigned_long local_58;
  void *local_50;
  undefined8 local_48;
  PaUtilBufferProcessor *local_40;
  ulong local_38;
  
  if (s == (PaStream *)0x0) {
    __assert_fail("stream",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jitsi[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c"
                  ,0x118d,"PaError ReadStream(PaStream *, void *, unsigned long)");
  }
  local_48 = *(undefined8 *)((long)s + 0x340);
  if (*(long *)((long)s + 0x2c0) == 0) {
    PaUtil_DebugPrint(
                     "Expression \'stream->capture.pcm\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_1510/jitsi[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 4495\n"
                     );
    local_60 = -0x26f7;
  }
  else {
    *(undefined8 *)((long)s + 0x340) = 0;
    local_60 = 0;
    if (0.0 < *(double *)((long)s + 0x280)) {
      *(undefined8 *)((long)s + 0x280) = 0;
      local_60 = -0x26fd;
    }
    local_50 = buffer;
    if (*(int *)((long)s + 0x298) == 0) {
      local_50 = *(void **)((long)s + 0x2e8);
      memcpy(local_50,buffer,(long)*(int *)((long)s + 0x290) << 3);
    }
    iVar1 = snd_pcm_state(*(undefined8 *)((long)s + 0x2c0));
    if ((iVar1 == 2) && (iVar1 = snd_pcm_start(*(undefined8 *)((long)s + 0x2c0)), iVar1 < 0)) {
      ReadStream_cold_1();
      local_60 = -9999;
    }
    else if (frames != 0) {
      local_40 = (PaUtilBufferProcessor *)((long)s + 0x68);
      do {
        local_5c = 0;
        paUtilErr_ = PaAlsaStream_WaitForFrames((PaAlsaStream *)s,&local_38,&local_5c);
        if (paUtilErr_ < 0) {
          format = 
          "Expression \'PaAlsaStream_WaitForFrames( stream, &framesAvail, &xrun )\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_1510/jitsi[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 4526\n"
          ;
LAB_0010fdb0:
          PaUtil_DebugPrint(format);
          iVar1 = 4;
          local_60 = paUtilErr_;
          iVar2 = paUtilErr_;
        }
        else if (local_5c == 0) {
          local_58 = local_38;
          if (frames <= local_38) {
            local_58 = frames;
          }
          paUtilErr_ = PaAlsaStream_SetUpBuffers((PaAlsaStream *)s,&local_58,&local_5c);
          if (paUtilErr_ < 0) {
            format = 
            "Expression \'PaAlsaStream_SetUpBuffers( stream, &framesGot, &xrun )\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_1510/jitsi[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 4545\n"
            ;
            goto LAB_0010fdb0;
          }
          iVar1 = 0;
          iVar2 = paUtilErr_;
          if (local_58 != 0) {
            numFrames = PaUtil_CopyInput(local_40,&local_50,local_58);
            local_58 = numFrames;
            paUtilErr_ = PaAlsaStream_EndProcessing((PaAlsaStream *)s,numFrames,&local_5c);
            if (paUtilErr_ < 0) {
              format = 
              "Expression \'PaAlsaStream_EndProcessing( stream, framesGot, &xrun )\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_1510/jitsi[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 4549\n"
              ;
              goto LAB_0010fdb0;
            }
            frames = frames - numFrames;
            iVar1 = 0;
            iVar2 = paUtilErr_;
          }
        }
        else {
          iVar2 = snd_pcm_state(*(undefined8 *)((long)s + 0x2c0));
          iVar1 = 7;
          if ((iVar2 == 2) && (iVar2 = snd_pcm_start(*(undefined8 *)((long)s + 0x2c0)), iVar2 < 0))
          {
            ReadStream_cold_2();
            local_60 = -9999;
            iVar1 = 4;
            iVar2 = extraout_EAX;
          }
        }
        if ((iVar1 != 0) && (iVar1 != 7)) {
          if (iVar1 != 4) {
            return iVar2;
          }
          break;
        }
      } while (frames != 0);
    }
  }
  *(undefined8 *)((long)s + 0x340) = local_48;
  return local_60;
}

Assistant:

static PaError ReadStream( PaStream* s,
                           void *buffer,
                           unsigned long frames )
{
    PaSkeletonStream *stream = (PaSkeletonStream*)s;

    /* suppress unused variable warnings */
    (void) buffer;
    (void) frames;
    (void) stream;

    /* IMPLEMENT ME, see portaudio.h for required behavior*/

    return paNoError;
}